

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r6p_1lin.cpp
# Opt level: O0

bool testR6PSingleLin(void)

{
  bool bVar1;
  int iVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  RSSinglelinCameraPose *model_2;
  iterator __end3_2;
  iterator __begin3_2;
  RSSinglelinCameraPoseVector *__range3_2;
  bool ident_2;
  Vector2d temp_2;
  int i_2;
  RSSinglelinCameraPose *model_1;
  iterator __end3_1;
  iterator __begin3_1;
  RSSinglelinCameraPoseVector *__range3_1;
  bool ident_1;
  Vector2d temp_1;
  int i_1;
  RSSinglelinCameraPose *model;
  iterator __end3;
  iterator __begin3;
  RSSinglelinCameraPoseVector *__range3;
  bool ident;
  int res;
  RSSinglelinCameraPoseVector results;
  Vector2d temp;
  int i;
  RSSinglelinCameraPose gt;
  bool passed;
  int maxpow;
  int n_points;
  int direction;
  double r0;
  MatrixXd u;
  MatrixXd X;
  undefined4 in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff660;
  int in_stack_fffffffffffff664;
  undefined4 in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff66c;
  int in_stack_fffffffffffff670;
  uint in_stack_fffffffffffff674;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff680;
  MatrixBase<Eigen::Replicate<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1>_> *other;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_00;
  Matrix<double,_3,_1,_0,_3,_1> *this_01;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this_02;
  int in_stack_fffffffffffff6b4;
  RSSinglelinCameraPose *in_stack_fffffffffffff6d8;
  RSSinglelinCameraPose *in_stack_fffffffffffff6e0;
  __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
  local_838;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_830;
  byte local_821;
  int local_77c;
  reference local_698;
  RSSinglelinCameraPose *local_690;
  __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
  local_688;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_680;
  byte local_671;
  int local_5cc;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined4 local_508;
  undefined4 local_480;
  undefined4 local_3f8;
  reference local_2a8;
  RSSinglelinCameraPose *local_2a0;
  __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
  local_298;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_290;
  byte local_285;
  int local_284;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_280 [84];
  undefined4 local_22c;
  double in_stack_fffffffffffffe08;
  double in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  Vector3d *in_stack_fffffffffffffe20;
  Vector3d *in_stack_fffffffffffffe28;
  Vector3d *in_stack_fffffffffffffe30;
  int iVar3;
  undefined4 in_stack_fffffffffffffe3c;
  Vector2d *u_00;
  Vector3d *X_00;
  int in_stack_fffffffffffffe60;
  Matrix<double,_3,_1,_0,_3,_1> local_e0 [2];
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_b0 [24];
  MatrixBase<Eigen::Replicate<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1>_> local_98 [24];
  undefined8 local_80;
  undefined8 local_78;
  byte local_6d;
  undefined4 local_6c;
  int local_68;
  undefined4 local_64;
  undefined8 local_60;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_28;
  undefined4 local_24;
  byte local_1;
  
  srand(2);
  local_24 = 3;
  local_28 = 6;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffff680,
             (int *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (int *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
  local_44 = 2;
  local_48 = 6;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffff680,
             (int *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (int *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
  local_60 = 0;
  local_64 = 0;
  local_68 = 6;
  local_6c = 2;
  local_6d = 1;
  RSSinglelinCameraPose::RSSinglelinCameraPose
            ((RSSinglelinCameraPose *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660))
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (Scalar *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x34263d);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (Scalar *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x3426bd);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (Scalar *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x34273d);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (Scalar *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  X_00 = (Vector3d *)0x0;
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                    (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  u_00 = (Vector2d *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Scalar *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x3427bd);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_6,_0,_3,_6>_>::Random();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_6,_0,_3,_6>_>_>
              *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  local_80 = 0x3ff0000000000000;
  local_78 = 0;
  for (iVar3 = 0; iVar3 < local_68; iVar3 = iVar3 + 1) {
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)0x34282c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    in_stack_fffffffffffff658 = local_64;
    in_stack_fffffffffffff6b4 =
         rs1LinProjection(X_00,u_00,(Vector3d *)CONCAT44(in_stack_fffffffffffffe3c,iVar3),
                          in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                          in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe60);
    if (in_stack_fffffffffffff6b4 != 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, test failed due to projection function\n");
      local_1 = 0;
      local_22c = 1;
      goto LAB_003434dc;
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  }
  this_02 = local_280;
  std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::vector
            ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)0x342a2a);
  iVar2 = R6P1Lin(in_stack_fffffffffffff680,
                  (MatrixXd *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                  in_stack_fffffffffffff674,
                  (double)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                  in_stack_fffffffffffff664,
                  (RSSinglelinCameraPoseVector *)
                  CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  local_284 = iVar2;
  if (iVar2 == 1) {
    std::operator<<((ostream *)&std::cout,
                    "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned no solution\n"
                   );
    local_6d = 0;
  }
  else if (iVar2 == 2) {
    std::operator<<((ostream *)&std::cout,
                    "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 did not converge\n"
                   );
    local_6d = 0;
  }
  else {
    local_285 = 0;
    local_290 = local_280;
    local_298._M_current =
         (RSSinglelinCameraPose *)
         std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::begin
                   ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                    CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_2a0 = (RSSinglelinCameraPose *)
                std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::end
                          ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                           CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                               *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                              (__normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                               *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)),
          bVar1) {
      local_2a8 = __gnu_cxx::
                  __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                  ::operator*(&local_298);
      RSSinglelinCameraPose::RSSinglelinCameraPose
                ((RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      RSSinglelinCameraPose::RSSinglelinCameraPose
                ((RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      in_stack_fffffffffffff6a7 =
           isPoseApproxEqual<RSSinglelinCameraPose>
                     (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
      if ((bool)in_stack_fffffffffffff6a7) {
        local_285 = 1;
      }
      __gnu_cxx::
      __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
      ::operator++(&local_298);
    }
    if ((local_285 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned bad pose\n"
                     );
      local_6d = 0;
    }
  }
  local_80 = 0x3ff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random();
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x342c50);
  this_01 = local_e0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random();
  local_3f8 = 10;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
  ::operator/((MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)this,(int *)CONCAT44(in_stack_fffffffffffff6b4,iVar2));
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x342cbf);
  this_00 = local_b0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random();
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
  ::operator/(this_02,(double *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
  local_480 = 10;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)this,(int *)CONCAT44(in_stack_fffffffffffff6b4,iVar2));
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x342d4d);
  other = local_98;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random();
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
  ::operator/(this_02,(double *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
  local_508 = 10;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)this,(int *)CONCAT44(in_stack_fffffffffffff6b4,iVar2));
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x342ddb);
  local_78 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random((Index)this_00,(Index)other);
  local_5b8 = 0;
  local_5c0 = 0;
  local_5c8 = 0x4014000000000000;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (this_01,(Scalar *)this_00,(Scalar *)other,
             (Scalar *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::replicate
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator+(this_00,other);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1>_>_>
              *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x342ebd);
  for (local_5cc = 0; local_5cc < local_68; local_5cc = local_5cc + 1) {
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)0x342ee9);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    in_stack_fffffffffffff658 = local_64;
    in_stack_fffffffffffff67c =
         rs1LinProjection(X_00,u_00,(Vector3d *)CONCAT44(in_stack_fffffffffffffe3c,iVar3),
                          in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                          in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe60);
    if (in_stack_fffffffffffff67c != 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, test failed due to projection function\n");
      local_1 = 0;
      goto LAB_003434cf;
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  }
  iVar2 = R6P1Lin((MatrixXd *)other,
                  (MatrixXd *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                  in_stack_fffffffffffff674,
                  (double)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                  in_stack_fffffffffffff664,
                  (RSSinglelinCameraPoseVector *)
                  CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  local_284 = iVar2;
  if (iVar2 == 1) {
    std::operator<<((ostream *)&std::cout,
                    "R6P singlelin, RS in x direction, for random values returned no solution\n");
    local_6d = 0;
  }
  else if (iVar2 == 2) {
    std::operator<<((ostream *)&std::cout,
                    "R6P singlelin, RS in x direction, for random values did not converge\n");
    local_6d = 0;
  }
  else {
    local_671 = 0;
    local_680 = local_280;
    local_688._M_current =
         (RSSinglelinCameraPose *)
         std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::begin
                   ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                    CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_690 = (RSSinglelinCameraPose *)
                std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::end
                          ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                           CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                               *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                              (__normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                               *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)),
          bVar1) {
      local_698 = __gnu_cxx::
                  __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                  ::operator*(&local_688);
      RSSinglelinCameraPose::RSSinglelinCameraPose
                ((RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      RSSinglelinCameraPose::RSSinglelinCameraPose
                ((RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (RSSinglelinCameraPose *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      bVar1 = isPoseApproxEqual<RSSinglelinCameraPose>
                        (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
      in_stack_fffffffffffff674 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff674);
      if (bVar1) {
        local_671 = 1;
      }
      __gnu_cxx::
      __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
      ::operator++(&local_688);
    }
    if ((local_671 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in x direction, for random values returned bad pose\n");
      local_6d = 0;
    }
  }
  local_64 = 1;
  local_77c = 0;
  do {
    if (local_68 <= local_77c) {
      local_284 = R6P1Lin((MatrixXd *)other,(MatrixXd *)CONCAT44(in_stack_fffffffffffff67c,iVar2),
                          in_stack_fffffffffffff674,
                          (double)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                          in_stack_fffffffffffff664,
                          (RSSinglelinCameraPoseVector *)
                          CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      if (local_284 == 1) {
        std::operator<<((ostream *)&std::cout,
                        "R6P singlelin, RS in y direction, for random values returned no solution\n"
                       );
        local_6d = 0;
      }
      else if (local_284 == 2) {
        std::operator<<((ostream *)&std::cout,
                        "R6P singlelin, RS in y direction, for random values did not converge\n");
        local_6d = 0;
      }
      else {
        local_821 = 0;
        local_830 = local_280;
        local_838._M_current =
             (RSSinglelinCameraPose *)
             std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::begin
                       ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                        CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
        std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::end
                  ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                                  (__normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)),
              bVar1) {
          __gnu_cxx::
          __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
          ::operator*(&local_838);
          RSSinglelinCameraPose::RSSinglelinCameraPose
                    ((RSSinglelinCameraPose *)
                     CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                     (RSSinglelinCameraPose *)
                     CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          RSSinglelinCameraPose::RSSinglelinCameraPose
                    ((RSSinglelinCameraPose *)
                     CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                     (RSSinglelinCameraPose *)
                     CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          bVar1 = isPoseApproxEqual<RSSinglelinCameraPose>
                            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
          if (bVar1) {
            local_821 = 1;
          }
          __gnu_cxx::
          __normal_iterator<RSSinglelinCameraPose_*,_std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>_>
          ::operator++(&local_838);
        }
        if ((local_821 & 1) == 0) {
          std::operator<<((ostream *)&std::cout,
                          "R6P singlelin, RS in y direction, for random values returned bad pose\n")
          ;
          local_6d = 0;
        }
      }
      local_1 = local_6d & 1;
LAB_003434cf:
      local_22c = 1;
      std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::~vector
                ((vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
LAB_003434dc:
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x3434e9);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x3434f6);
      return (bool)(local_1 & 1);
    }
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)0x3431ea);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    in_stack_fffffffffffff658 = local_64;
    in_stack_fffffffffffff670 =
         rs1LinProjection(X_00,u_00,(Vector3d *)CONCAT44(in_stack_fffffffffffffe3c,iVar3),
                          in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                          in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe60);
    if (in_stack_fffffffffffff670 != 0) {
      std::operator<<((ostream *)&std::cout,
                      "R6P singlelin, RS in y direction, test failed due to projection function\n");
      local_1 = 0;
      goto LAB_003434cf;
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               ((ulong)in_stack_fffffffffffff674 << 0x20),
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_77c = local_77c + 1;
  } while( true );
}

Assistant:

bool testR6PSingleLin(){
    std::srand(2);
    Eigen::MatrixXd X(3,6);
    Eigen::MatrixXd u(2,6);
    
    double r0 = 0;
    int direction = 0;
    int n_points = 6;
    int maxpow = 2;
    
    bool passed = true;



    // // first test all zeros and f = 1 and X random
    RSSinglelinCameraPose gt;
    gt.v << 0,0,0;
    gt.w << 0,0,0;
    gt.C << 0,0,0;
    gt.t << 0,0,0;
    X = Eigen::Matrix<double,3,6>::Random();
    gt.f = 1;
    gt.rd = 0;


    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in x direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }

    RSSinglelinCameraPoseVector results;

    int res = R6P1Lin(X, u, direction, r0, maxpow, &results);
    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned bad pose\n";
            passed = false;
        }
    }

    // now test with random reasonable values

    gt.f = 1;
    gt.C << Eigen::Vector3d::Random();
    gt.v << Eigen::Vector3d::Random()/10;
    gt.w << Eigen::Vector3d::Random()/gt.f/10;
    gt.t << Eigen::Vector3d::Random()/gt.f/10;
    gt.rd = 0;
    X << Eigen::MatrixXd::Random(3,6) + Eigen::Vector3d(0,0,5).replicate(1,6);
    
    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in x direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }


    res = R6P1Lin(X, u, direction, r0, maxpow, &results);

    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in x direction, for random values returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in x direction, for random values did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in x direction, for random values returned bad pose\n";
            passed = false;
        }
    }

    
    

    // Now test with the other RS direction
    direction = 1;
    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in y direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }

    res = R6P1Lin(X, u, direction, r0, maxpow, &results);

    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in y direction, for random values returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in y direction, for random values did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in y direction, for random values returned bad pose\n";
            passed = false;
        }
    }

    return passed;

}